

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logistics_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Logistics_Header::Logistics_Header
          (Logistics_Header *this,EntityIdentifier *ReceivingEntityID,
          EntityIdentifier *SupplyingEntityID)

{
  EntityIdentifier *SupplyingEntityID_local;
  EntityIdentifier *ReceivingEntityID_local;
  Logistics_Header *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Logistics_Header_0033d6a0;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_ReceivingEntity,ReceivingEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_SupplyingEntity,SupplyingEntityID);
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x03';
  return;
}

Assistant:

Logistics_Header::Logistics_Header( const EntityIdentifier & ReceivingEntityID, const EntityIdentifier & SupplyingEntityID ) :
    m_ReceivingEntity( ReceivingEntityID ),
    m_SupplyingEntity( SupplyingEntityID )
{
    m_ui8ProtocolFamily = Logistics;
}